

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

bool __thiscall
QSocks5PasswordAuthenticator::continueAuthenticate
          (QSocks5PasswordAuthenticator *this,QTcpSocket *socket,bool *completed)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *completed = false;
  lVar1 = (**(code **)(*(long *)&socket->super_QAbstractSocket + 0xa0))(socket);
  bVar2 = true;
  if (1 < lVar1) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QIODevice::read((longlong)&local_48);
    if ((*local_48.ptr == '\x01') && (local_48.ptr[1] == '\0')) {
      *completed = true;
      bVar2 = true;
    }
    else {
      (**(code **)(*(long *)&socket->super_QAbstractSocket + 0x70))(socket);
      bVar2 = false;
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5PasswordAuthenticator::continueAuthenticate(QTcpSocket *socket, bool *completed)
{
    *completed = false;

    if (socket->bytesAvailable() < 2)
        return true;

    QByteArray buf = socket->read(2);
    if (buf.at(0) == S5_PASSWORDAUTH_VERSION && buf.at(1) == 0x00) {
        *completed = true;
        return true;
    }

    // must disconnect
    socket->close();
    return false;
}